

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O0

string * tinyusdz::anon_unknown_160::GetExtension(string *__return_storage_ptr__,string *name)

{
  string local_38;
  string *local_18;
  string *name_local;
  
  local_18 = name;
  name_local = __return_storage_ptr__;
  io::GetFileExtension(&local_38,name);
  to_lower(__return_storage_ptr__,&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string GetExtension(const std::string &name) {
  return to_lower(io::GetFileExtension(name));
}